

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O1

void __thiscall xercesc_4_0::SchemaGrammar::reset(SchemaGrammar *this)

{
  NameIdPool<xercesc_4_0::XMLNotationDecl> *pNVar1;
  
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::removeAll
            (this->fElemDeclPool);
  if (this->fElemNonDeclPool !=
      (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
    RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::removeAll
              (this->fElemNonDeclPool);
  }
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::removeAll
            (this->fGroupElemDeclPool);
  pNVar1 = this->fNotationDeclPool;
  if (pNVar1->fIdCounter != 0) {
    RefHashTableOf<xercesc_4_0::XMLNotationDecl,_xercesc_4_0::StringHasher>::removeAll
              (&pNVar1->fBucketList);
    pNVar1->fIdCounter = 0;
  }
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::removeAll(this->fAnnotations);
  this->fValidated = false;
  return;
}

Assistant:

void SchemaGrammar::reset()
{
    //
    //  We need to reset all of the pools.
    //
    fElemDeclPool->removeAll();
    if(fElemNonDeclPool)
        fElemNonDeclPool->removeAll();
    fGroupElemDeclPool->removeAll();
    fNotationDeclPool->removeAll();
    fAnnotations->removeAll();
    fValidated = false;
}